

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

TimerHolder __thiscall
Liby::EventLoop::runEvery(EventLoop *this,Timestamp *timestamp,BasicHandler *handler)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  BasicHandler *pBVar3;
  _Head_base<0UL,_Liby::Poller_*,_false> _Var4;
  TimerQueue *this_00;
  int iVar5;
  _func_void *p_Var6;
  function<void_()> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  TimerHolder TVar8;
  WeakTimerHolder weak_holder;
  Timer timer;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  unique_ptr<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_> *local_178;
  undefined1 local_170 [8];
  function<void_()> local_168;
  uint64_t local_148;
  __time_t local_140;
  __suseconds_t _Stack_138;
  _Any_data local_130;
  code *local_120;
  element_type *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  WeakTimerHolder local_f0;
  Timer local_a8;
  __atomic_base<unsigned_long> local_68;
  __int_type_conflict local_60;
  pointer ppCStack_58;
  _Any_data local_50;
  code *local_40;
  
  local_a8.handler_._M_invoker = (_Invoker_type)0x0;
  local_a8.handler_.super__Function_base._M_functor._8_8_ = 0;
  local_a8.handler_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_a8.timeout_.tv_.tv_usec = 0;
  local_a8.handler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a8.id_ = 0;
  local_a8.timeout_.tv_.tv_sec = 0;
  (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
  super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
  super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl = (Poller *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Liby::Timer,std::allocator<Liby::Timer>,Liby::Timer_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->equeue_,(Timer **)this,
             (allocator<Liby::Timer> *)local_170,&local_a8);
  local_178 = &this->equeue_;
  WeakTimerHolder::WeakTimerHolder(&local_f0,(TimerHolder *)this);
  _Var4._M_head_impl =
       (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
       _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
       super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (Poller *)0x0) {
    local_170 = (undefined1  [8])timestamp;
    std::function<void_()>::function(&local_168,in_RCX);
    local_148 = local_f0.timer_.id_;
    local_140 = local_f0.timer_.timeout_.tv_.tv_sec;
    _Stack_138 = local_f0.timer_.timeout_.tv_.tv_usec;
    std::function<void_()>::function((function<void_()> *)&local_130,&local_f0.timer_.handler_);
    local_110 = local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    p_Stack_108 = local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count =
             (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count =
             (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    local_100 = *(undefined8 *)&(handler->super__Function_base)._M_functor;
    uStack_f8 = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    local_198._M_unused._M_object = (void *)0x0;
    local_198._8_8_ = 0;
    local_188 = (code *)0x0;
    pcStack_180 = (code *)0x0;
    p_Var6 = (_func_void *)operator_new(0x80);
    *(undefined1 (*) [8])p_Var6 = local_170;
    std::function<void_()>::function((function<void_()> *)(p_Var6 + 8),&local_168);
    *(uint64_t *)(p_Var6 + 0x28) = local_148;
    *(__time_t *)(p_Var6 + 0x30) = local_140;
    *(__suseconds_t *)(p_Var6 + 0x38) = _Stack_138;
    std::function<void_()>::function
              ((function<void_()> *)(p_Var6 + 0x40),(function<void_()> *)&local_130);
    *(element_type **)(p_Var6 + 0x60) = local_110;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var6 + 0x68) = p_Stack_108;
    local_110 = (element_type *)0x0;
    p_Stack_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)(p_Var6 + 0x70) = local_100;
    *(undefined8 *)(p_Var6 + 0x78) = uStack_f8;
    pcStack_180 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.cpp:92:31)>
                  ::_M_invoke;
    local_188 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.cpp:92:31)>
                ::_M_manager;
    LOCK();
    UNLOCK();
    local_68 = Timer::timerIds_.super___atomic_base<unsigned_long>._M_i;
    local_60 = *(__int_type_conflict *)&(handler->super__Function_base)._M_functor;
    ppCStack_58 = *(pointer *)((long)&(handler->super__Function_base)._M_functor + 8);
    Timer::timerIds_.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         (__atomic_base<unsigned_long>)
         (Timer::timerIds_.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
    local_198._M_unused._0_8_ = (undefined8)p_Var6;
    std::function<void_()>::function((function<void_()> *)&local_50,(function<void_()> *)&local_198)
    ;
    (_Var4._M_head_impl)->_vptr_Poller = (_func_int **)local_68._M_i;
    *(__int_type_conflict *)
     &((_Var4._M_head_impl)->channels_).
      super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_> = local_60;
    ((_Var4._M_head_impl)->channels_).
    super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCStack_58;
    std::function<void_()>::operator=
              ((function<void_()> *)
               &((_Var4._M_head_impl)->channels_).
                super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(function<void_()> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_188 != (code *)0x0) {
      (*local_188)(&local_198,&local_198,__destroy_functor);
    }
    if (p_Stack_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)p_Stack_108 + 0xc);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)p_Stack_108 + 0xc);
        *(int *)((long)p_Stack_108 + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*(long *)p_Stack_108 + 0x18))();
      }
    }
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    if (local_168.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_168.super__Function_base._M_manager)
                ((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
    }
    this_00 = (TimerQueue *)timestamp[1].tv_.tv_sec;
    local_170 = (undefined1  [8])
                (this->poller_)._M_t.
                super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
                super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
                super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
    local_168.super__Function_base._M_functor._M_unused._M_object =
         (this->equeue_)._M_t.
         super___uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>._M_t.
         super__Tuple_impl<0UL,_Liby::EventQueue_*,_std::default_delete<Liby::EventQueue>_>.
         super__Head_base<0UL,_Liby::EventQueue_*,_false>._M_head_impl;
    if ((EventQueue *)local_168.super__Function_base._M_functor._M_unused._0_8_ != (EventQueue *)0x0
       ) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((EventQueue *)local_168.super__Function_base._M_functor._M_unused._0_8_)->eventfd_ =
             ((EventQueue *)local_168.super__Function_base._M_functor._M_unused._0_8_)->eventfd_ + 1
        ;
        UNLOCK();
      }
      else {
        ((EventQueue *)local_168.super__Function_base._M_functor._M_unused._0_8_)->eventfd_ =
             ((EventQueue *)local_168.super__Function_base._M_functor._M_unused._0_8_)->eventfd_ + 1
        ;
      }
    }
    TimerQueue::insert(this_00,(shared_ptr<Liby::Timer> *)local_170);
    _Var7._M_pi = extraout_RDX;
    if ((EventQueue *)local_168.super__Function_base._M_functor._M_unused._0_8_ != (EventQueue *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_168.super__Function_base._M_functor._M_unused._0_8_);
      _Var7._M_pi = extraout_RDX_00;
    }
    if (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar5 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar5 = (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(local_f0.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        _Var7._M_pi = extraout_RDX_01;
      }
    }
    if (local_f0.timer_.handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
      pBVar3 = &local_f0.timer_.handler_;
      (*local_f0.timer_.handler_.super__Function_base._M_manager)
                ((_Any_data *)pBVar3,(_Any_data *)pBVar3,__destroy_functor);
      _Var7._M_pi = extraout_RDX_02;
    }
    if (local_a8.handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_a8.handler_.super__Function_base._M_manager)
                ((_Any_data *)&local_a8.handler_,(_Any_data *)&local_a8.handler_,__destroy_functor);
      _Var7._M_pi = extraout_RDX_03;
    }
    TVar8.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    TVar8.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (TimerHolder)TVar8.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("timerPtr_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.h"
                ,0x45,"Timer &Liby::TimerHolder::getTimer() const");
}

Assistant:

TimerHolder EventLoop::runEvery(const Timestamp &timestamp,
                                const BasicHandler &handler) {
    Timer timer;
    TimerHolder holder(timer);
    WeakTimerHolder weak_holder(holder);
    Timer &timer1 = holder.getTimer();
    timer1 = Timer(timestamp, [this, handler, weak_holder, timestamp] {
        if (!weak_holder.getWeakTimerPtr().expired()) {
            auto timer = weak_holder.getWeakTimerPtr().lock();
            timer->setTimeout(timestamp + Timestamp::now());
            tqueue_->insert(weak_holder.getWeakTimerPtr().lock());
            handler();
        }
    });
    tqueue_->insert(holder.getTimerPtr());
    return holder;
}